

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O1

ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> * __thiscall
mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>::operator=
          (ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&> *this,
          ValueMap<std::vector<int,_std::allocator<int>_>,_int> *m)

{
  _Base_ptr p_Var1;
  _Base_ptr *this_00;
  _Rb_tree_header *p_Var2;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_mp::pre::ValueNode>_>,_bool> pVar3;
  string local_168;
  ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&> *local_148;
  vector<int,_std::allocator<int>_> local_140;
  pair<const_int,_mp::pre::ValueNode> local_128;
  ValueNode local_a8;
  
  p_Var1 = (m->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(m->map_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    local_148 = this + 0x28;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_140,(vector<int,_std::allocator<int>_> *)&p_Var1[1]._M_parent);
      local_168._M_string_length = 0;
      local_168.field_2._M_local_buf[0] = '\0';
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      ValueNode::ValueNode(&local_a8,*(BasicValuePresolver **)this,&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,
                        CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                 local_168.field_2._M_local_buf[0]) + 1);
      }
      local_128.first = p_Var1[1]._M_color;
      ValueNode::ValueNode(&local_128.second,&local_a8);
      pVar3 = std::
              _Rb_tree<int,std::pair<int_const,mp::pre::ValueNode>,std::_Select1st<std::pair<int_const,mp::pre::ValueNode>>,std::less<int>,std::allocator<std::pair<int_const,mp::pre::ValueNode>>>
              ::_M_insert_unique<std::pair<int_const,mp::pre::ValueNode>>
                        ((_Rb_tree<int,std::pair<int_const,mp::pre::ValueNode>,std::_Select1st<std::pair<int_const,mp::pre::ValueNode>>,std::less<int>,std::allocator<std::pair<int_const,mp::pre::ValueNode>>>
                          *)local_148,&local_128);
      this_00 = &pVar3.first._M_node._M_node[1]._M_left;
      std::vector<int,_std::allocator<int>_>::_M_move_assign
                ((vector<int,_std::allocator<int>_> *)this_00,&local_140,pVar3._8_8_);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)this_00,
                 (size_type)pVar3.first._M_node._M_node[3]._M_right);
      ValueNode::~ValueNode(&local_128.second);
      ValueNode::~ValueNode(&local_a8);
      if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return (ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *)this;
}

Assistant:

ValueMap& operator=(const ValueMap<Array2>& m) {
    for (const auto& a2: m.GetMap())
      map_.insert({
                    a2.first, CreateArray<Array, Param>(prm_)
                  }).first->second =
          a2.second;
    return *this;
  }